

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_cons_euler_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *scalar;
  REF_DBL *grad;
  int iVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  char filename [32];
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_BOOL debug_export;
  REF_DBL *grad_lam;
  REF_DBL *lam;
  REF_DBL direction [3];
  REF_DBL local_158;
  REF_DBL dflux_dcons [25];
  REF_DBL local_88;
  REF_DBL state [5];
  int local_50;
  REF_INT nequ;
  REF_INT i;
  REF_INT node;
  REF_INT dir;
  REF_INT var;
  REF_NODE ref_node;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *prim_dual_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  REF_DBL *g_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xb8c,
           "ref_metric_cons_euler_g","malloc lam of REF_DBL negative");
    g_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xb8c,"ref_metric_cons_euler_g","malloc lam of REF_DBL NULL");
      g_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        scalar[ref_private_macro_code_rss] = 0.0;
      }
      if (pRVar1->max * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xb8d,"ref_metric_cons_euler_g","malloc grad_lam of REF_DBL negative");
        g_local._4_4_ = 1;
      }
      else {
        grad = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
        if (grad == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xb8d,"ref_metric_cons_euler_g","malloc grad_lam of REF_DBL NULL");
          g_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0;
              SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 3) !=
              ref_private_macro_code_rss_1 + pRVar1->max * -3 < 0;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            grad[ref_private_macro_code_rss_1] = 0.0;
          }
          for (node = 0; node < 5; node = node + 1) {
            for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
              if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
                scalar[nequ] = prim_dual[node + ldim / 2 + ldim * nequ];
              }
            }
            uVar2 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xb94,"ref_metric_cons_euler_g",(ulong)uVar2,"grad_lam");
              return uVar2;
            }
            for (i = 0; i < 3; i = i + 1) {
              for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
                if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
                  lam = (REF_DBL *)0x0;
                  direction[0] = 0.0;
                  direction[1] = 0.0;
                  direction[(long)i + -1] = 1.0;
                  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
                    state[(long)local_50 + -1] = prim_dual[local_50 + ldim * nequ];
                  }
                  uVar2 = ref_phys_euler_jac(&local_88,(REF_DBL *)&lam,&local_158);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xb9e,"ref_metric_cons_euler_g",(ulong)uVar2,"euler");
                    return uVar2;
                  }
                  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
                    iVar3 = local_50 + nequ * 5;
                    g[iVar3] = dflux_dcons[(long)(node + local_50 * 5) + -1] * grad[i + nequ * 3] +
                               g[iVar3];
                  }
                }
              }
            }
          }
          if (grad != (REF_DBL *)0x0) {
            free(grad);
          }
          if (scalar != (REF_DBL *)0x0) {
            free(scalar);
          }
          g_local._4_4_ = 0;
        }
      }
    }
  }
  return g_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_euler_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], dflux_dcons[25], direction[3];
  REF_DBL *lam, *grad_lam;
  REF_BOOL debug_export = REF_FALSE;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler_jac(state, direction, dflux_dcons), "euler");
        for (i = 0; i < 5; i++) {
          g[i + 5 * node] +=
              dflux_dcons[var + i * 5] * grad_lam[dir + 3 * node];
        }
      }
    }

    if (debug_export) {
      char filename[32];
      snprintf(filename, 32, "gradlam%d.tec", var);
      ref_gather_scalar_by_extension(ref_grid, 3, grad_lam, NULL, filename);
    }
  }
  ref_free(grad_lam);
  ref_free(lam);

  if (debug_export) {
    RSS(ref_gather_scalar_by_extension(ref_grid, 5, g, NULL, "g.tec"),
        "dump g");
  }

  return REF_SUCCESS;
}